

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::lts_20250127::log_internal::RawSetMinLogLevel(LogSeverityAtLeast severity)

{
  LogSeverityAtLeast severity_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  lts_20250127::(anonymous_namespace)::min_log_level = severity;
  return;
}

Assistant:

void RawSetMinLogLevel(absl::LogSeverityAtLeast severity) {
  min_log_level.store(static_cast<int>(severity), std::memory_order_release);
}